

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_extrakeys_ge_even_y(secp256k1_ge *r)

{
  int iVar1;
  uint local_14;
  int y_parity;
  secp256k1_ge *r_local;
  
  secp256k1_ge_is_infinity(r);
  iVar1 = secp256k1_fe_is_odd(&r->y);
  if (iVar1 != 0) {
    secp256k1_fe_negate(&r->y,&r->y,1);
  }
  local_14 = (uint)(iVar1 != 0);
  return local_14;
}

Assistant:

static int secp256k1_extrakeys_ge_even_y(secp256k1_ge *r) {
    int y_parity = 0;
    VERIFY_CHECK(!secp256k1_ge_is_infinity(r));

    if (secp256k1_fe_is_odd(&r->y)) {
        secp256k1_fe_negate(&r->y, &r->y, 1);
        y_parity = 1;
    }
    return y_parity;
}